

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Blockchain.cpp
# Opt level: O0

void __thiscall Blockchain::Blockchain(Blockchain *this)

{
  size_t sVar1;
  allocator local_101;
  string local_100 [55];
  allocator local_c9;
  string local_c8 [32];
  Block local_a8;
  Blockchain *local_10;
  Blockchain *this_local;
  
  this->_bIndex = 1;
  local_10 = this;
  std::vector<Block,_std::allocator<Block>_>::vector(&this->_bChain);
  sVar1 = this->_bIndex;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_c8,"Genesis Block",&local_c9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_100,anon_var_dwarf_21f85 + 0xc,&local_101);
  Block::Block(&local_a8,(uint32_t)sVar1,(string *)local_c8,(string *)local_100);
  std::vector<Block,_std::allocator<Block>_>::emplace_back<Block>(&this->_bChain,&local_a8);
  Block::~Block(&local_a8);
  std::__cxx11::string::~string(local_100);
  std::allocator<char>::~allocator((allocator<char> *)&local_101);
  std::__cxx11::string::~string(local_c8);
  std::allocator<char>::~allocator((allocator<char> *)&local_c9);
  return;
}

Assistant:

Blockchain::Blockchain()
{
	_bChain.emplace_back(Block(_bIndex,"Genesis Block", ""));
}